

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseEndTag2(xmlParserCtxtPtr ctxt,xmlStartTag *tag)

{
  xmlChar *local_20;
  xmlChar *name;
  xmlStartTag *tag_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (((ctxt->input->flags & 0x40U) == 0) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  if ((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '/')) {
    ctxt->input->cur = ctxt->input->cur + 2;
    ctxt->input->col = ctxt->input->col + 2;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    if (tag->prefix == (xmlChar *)0x0) {
      local_20 = xmlParseNameAndCompare(ctxt,ctxt->name);
    }
    else {
      local_20 = xmlParseQNameAndCompare(ctxt,ctxt->name,tag->prefix);
    }
    if (((ctxt->input->flags & 0x40U) == 0) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    if (((((*ctxt->input->cur < 9) || (10 < *ctxt->input->cur)) && (*ctxt->input->cur != '\r')) &&
        (*ctxt->input->cur < 0x20)) || (*ctxt->input->cur != '>')) {
      xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
    }
    else {
      ctxt->input->col = ctxt->input->col + 1;
      ctxt->input->cur = ctxt->input->cur + 1;
      if (*ctxt->input->cur == '\0') {
        xmlParserGrow(ctxt);
      }
    }
    if (local_20 != (xmlChar *)0x1) {
      if (local_20 == (xmlChar *)0x0) {
        local_20 = "unparsable";
      }
      xmlFatalErrMsgStrIntStr
                (ctxt,XML_ERR_TAG_NAME_MISMATCH,
                 "Opening and ending tag mismatch: %s line %d and %s\n",ctxt->name,tag->line,
                 local_20);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (ctxt->sax->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0)) {
      (*ctxt->sax->endElementNs)(ctxt->userData,ctxt->name,tag->prefix,tag->URI);
    }
    spacePop(ctxt);
    if (tag->nsNr != 0) {
      xmlParserNsPop(ctxt,tag->nsNr);
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_LTSLASH_REQUIRED,(char *)0x0);
  }
  return;
}

Assistant:

static void
xmlParseEndTag2(xmlParserCtxtPtr ctxt, const xmlStartTag *tag) {
    const xmlChar *name;

    GROW;
    if ((RAW != '<') || (NXT(1) != '/')) {
	xmlFatalErr(ctxt, XML_ERR_LTSLASH_REQUIRED, NULL);
	return;
    }
    SKIP(2);

    if (tag->prefix == NULL)
        name = xmlParseNameAndCompare(ctxt, ctxt->name);
    else
        name = xmlParseQNameAndCompare(ctxt, ctxt->name, tag->prefix);

    /*
     * We should definitely be at the ending "S? '>'" part
     */
    GROW;
    SKIP_BLANKS;
    if ((!IS_BYTE_CHAR(RAW)) || (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
    } else
	NEXT1;

    /*
     * [ WFC: Element Type Match ]
     * The Name in an element's end-tag must match the element type in the
     * start-tag.
     *
     */
    if (name != (xmlChar*)1) {
        if (name == NULL) name = BAD_CAST "unparsable";
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
		     "Opening and ending tag mismatch: %s line %d and %s\n",
		                ctxt->name, tag->line, name);
    }

    /*
     * SAX: End of Tag
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
	(!ctxt->disableSAX))
	ctxt->sax->endElementNs(ctxt->userData, ctxt->name, tag->prefix,
                                tag->URI);

    spacePop(ctxt);
    if (tag->nsNr != 0)
	xmlParserNsPop(ctxt, tag->nsNr);
}